

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void check_arguments(int argc,char **argv)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  string usage_instructions;
  char *local_40;
  long local_38;
  char local_30 [16];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Usage instructions: ","");
  std::__cxx11::string::append((char *)&local_40);
  std::__cxx11::string::append((char *)&local_40);
  if (argc == 3) {
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
    return;
  }
  if (argc != 1) {
    if (argc == 2) {
      lVar2 = 0x1f;
      pcVar3 = "Please include an output file.\n";
    }
    else {
      if (argc < 4) goto LAB_001133b0;
      lVar2 = 0x14;
      pcVar3 = "Too many arguments.\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar3,lVar2);
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_40,local_38);
  std::endl<char,std::char_traits<char>>(poVar1);
LAB_001133b0:
  exit(1);
}

Assistant:

void check_arguments(int argc, char* argv[]) {
  string usage_instructions = "Usage instructions: ";
  usage_instructions += argv[0];
  usage_instructions += " path/to/input.txt output.txt";

  bool has_valid_args = false;

  // make sure the user has provided input and output files
  if (argc == 1) {
    cerr << usage_instructions << endl;
  } else if (argc == 2) {
    cerr << "Please include an output file.\n" << usage_instructions << endl;
  } else if (argc == 3) {
    has_valid_args = true;
  } else if (argc > 3) {
    cerr << "Too many arguments.\n" << usage_instructions << endl;
  }

  if (!has_valid_args) {
    exit(EXIT_FAILURE);
  }
}